

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult __thiscall
VmaAllocator_T::FlushOrInvalidateAllocations
          (VmaAllocator_T *this,uint32_t allocationCount,VmaAllocation *allocations,
          VkDeviceSize *offsets,VkDeviceSize *sizes,VMA_CACHE_OPERATION op)

{
  size_t sVar1;
  bool bVar2;
  VkResult VVar3;
  VkMappedMemoryRange *pVVar4;
  long lVar5;
  VkDeviceSize size;
  VkDeviceSize offset;
  ulong uVar6;
  VkMappedMemoryRange newRange;
  RangeVector ranges;
  VkMappedMemoryRange local_300;
  VmaSmallVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>,_16UL> local_2d8;
  
  local_2d8.m_Count = 0;
  local_2d8.m_DynamicArray.m_Allocator.m_pCallbacks = &this->m_AllocationCallbacks;
  if (this->m_AllocationCallbacksSpecified == false) {
    local_2d8.m_DynamicArray.m_Allocator.m_pCallbacks = (VkAllocationCallbacks *)0x0;
  }
  local_2d8.m_DynamicArray.m_pArray = (VkMappedMemoryRange *)0x0;
  local_2d8.m_DynamicArray.m_Count = 0;
  local_2d8.m_DynamicArray.m_Capacity = 0;
  VVar3 = VK_SUCCESS;
  if (allocationCount != 0) {
    uVar6 = 0;
    do {
      if (offsets == (VkDeviceSize *)0x0) {
        offset = 0;
      }
      else {
        offset = offsets[uVar6];
      }
      if (sizes == (VkDeviceSize *)0x0) {
        size = 0xffffffffffffffff;
      }
      else {
        size = sizes[uVar6];
      }
      bVar2 = GetFlushOrInvalidateRange(this,allocations[uVar6],offset,size,&local_300);
      sVar1 = local_2d8.m_Count;
      if (bVar2) {
        VmaSmallVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>,_16UL>::resize
                  (&local_2d8,local_2d8.m_Count + 1,false);
        pVVar4 = local_2d8.m_StaticArray;
        if (0x10 < local_2d8.m_Count) {
          pVVar4 = local_2d8.m_DynamicArray.m_pArray;
        }
        pVVar4[sVar1].size = local_300.size;
        pVVar4[sVar1].memory = local_300.memory;
        (&pVVar4[sVar1].memory)[1] = (VkDeviceMemory)local_300.offset;
        pVVar4 = pVVar4 + sVar1;
        pVVar4->sType = local_300.sType;
        *(undefined4 *)&pVVar4->field_0x4 = local_300._4_4_;
        *(undefined4 *)&pVVar4->pNext = local_300.pNext._0_4_;
        *(undefined4 *)((long)&pVVar4->pNext + 4) = local_300.pNext._4_4_;
      }
      uVar6 = uVar6 + 1;
    } while (allocationCount != uVar6);
    VVar3 = VK_SUCCESS;
    if (local_2d8.m_Count != 0) {
      if (op == VMA_CACHE_FLUSH) {
        lVar5 = 0x1688;
      }
      else {
        VVar3 = VK_SUCCESS;
        if (op != VMA_CACHE_INVALIDATE) goto LAB_001c0d27;
        lVar5 = 0x1690;
      }
      pVVar4 = local_2d8.m_DynamicArray.m_pArray;
      if (local_2d8.m_Count < 0x11) {
        pVVar4 = local_2d8.m_StaticArray;
      }
      VVar3 = (**(code **)(&this->m_UseMutex + lVar5))(this->m_hDevice,local_2d8.m_Count,pVVar4);
    }
  }
LAB_001c0d27:
  VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::~VmaVector
            (&local_2d8.m_DynamicArray);
  return VVar3;
}

Assistant:

const VkAllocationCallbacks* GetAllocationCallbacks() const
    {
        return m_AllocationCallbacksSpecified ? &m_AllocationCallbacks : VMA_NULL;
    }